

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys_test.c
# Opt level: O0

REF_STATUS xy_primitive(REF_INT ldim,REF_DBL *volume,REF_INT node,REF_DBL *primitive)

{
  REF_DBL RVar1;
  int local_34;
  REF_INT i;
  REF_DBL tempu;
  REF_DBL *primitive_local;
  REF_INT node_local;
  REF_DBL *volume_local;
  REF_INT ldim_local;
  
  for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
    primitive[local_34] = volume[local_34 + ldim * node];
  }
  RVar1 = primitive[3];
  primitive[3] = primitive[2];
  primitive[2] = RVar1;
  return 0;
}

Assistant:

static REF_STATUS xy_primitive(REF_INT ldim, REF_DBL *volume, REF_INT node,
                               REF_DBL *primitive) {
  REF_DBL tempu;
  REF_INT i;
  for (i = 0; i < 5; i++) primitive[i] = volume[i + ldim * node];
  tempu = primitive[3];
  primitive[3] = primitive[2];
  primitive[2] = tempu;
  return REF_SUCCESS;
}